

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O3

Gia_Man_t * Gia_ManVerifyCexAndMove(Gia_Man_t *pGia,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  
  Gia_ManCleanMark0(pGia);
  iVar15 = pGia->nRegs;
  if (iVar15 < 1) {
    uVar7 = 0;
  }
  else {
    uVar16 = 0;
    do {
      iVar10 = pGia->vCis->nSize;
      uVar12 = (iVar10 - iVar15) + uVar16;
      if (((int)uVar12 < 0) || (iVar10 <= (int)uVar12)) goto LAB_00589000;
      iVar10 = pGia->vCis->pArray[uVar12];
      lVar6 = (long)iVar10;
      if ((lVar6 < 0) || (pGia->nObjs <= iVar10)) goto LAB_00588fe1;
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        uVar7 = (ulong)uVar16;
        break;
      }
      uVar12 = uVar16 + 1;
      uVar7 = (ulong)uVar12;
      *(ulong *)(pGVar4 + lVar6) =
           *(ulong *)(pGVar4 + lVar6) & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[uVar16 >> 5] >> ((byte)uVar16 & 0x1f) & 1) << 0x1e);
      iVar15 = pGia->nRegs;
      uVar16 = uVar12;
    } while ((int)uVar12 < iVar15);
  }
  iVar10 = (int)uVar7;
  if (-1 < p->iFrame) {
    iVar14 = 0;
    do {
      pVVar11 = pGia->vCis;
      uVar17 = (ulong)(uint)pVVar11->nSize;
      if (iVar15 < pVVar11->nSize) {
        lVar6 = 0;
        do {
          if ((int)uVar17 <= lVar6) goto LAB_00589000;
          lVar18 = (long)pVVar11->pArray[lVar6];
          if ((lVar18 < 0) || (iVar15 = pGia->nObjs, iVar15 <= pVVar11->pArray[lVar6]))
          goto LAB_00588fe1;
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) {
            uVar7 = (ulong)(uint)((int)uVar7 + (int)lVar6);
            goto LAB_00588bde;
          }
          *(ulong *)(pGVar4 + lVar18) =
               *(ulong *)(pGVar4 + lVar18) & 0xffffffffbfffffff |
               (ulong)(((uint)(&p[1].iPo)[(int)(uVar7 + lVar6) >> 5] >>
                        ((byte)(uVar7 + lVar6) & 0x1f) & 1) << 0x1e);
          lVar6 = lVar6 + 1;
          pVVar11 = pGia->vCis;
          uVar17 = (ulong)pVVar11->nSize;
        } while (lVar6 < (long)(uVar17 - (long)pGia->nRegs));
        uVar7 = (ulong)(uint)((int)uVar7 + (int)lVar6);
      }
      iVar15 = pGia->nObjs;
      if (0 < iVar15) {
LAB_00588bde:
        lVar6 = 0;
        lVar18 = 0;
        do {
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar17 = *(ulong *)(&pGVar4->field_0x0 + lVar6);
          if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
            *(ulong *)(&pGVar4->field_0x0 + lVar6) =
                 uVar17 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar17 >> 0x3d) ^
                          *(uint *)((long)pGVar4 +
                                   (ulong)((uint)(uVar17 >> 0x1e) & 0x7ffffffc) * -3 + lVar6) >>
                          0x1e) & ((uint)(uVar17 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar4 +
                                           (ulong)(uint)((int)(uVar17 & 0x1fffffff) << 2) * -3 +
                                           lVar6) >> 0x1e) & 1) << 0x1e);
            iVar15 = pGia->nObjs;
          }
          lVar18 = lVar18 + 1;
          lVar6 = lVar6 + 0xc;
        } while (lVar18 < iVar15);
      }
      iVar10 = (int)uVar7;
      pVVar11 = pGia->vCos;
      if (0 < pVVar11->nSize) {
        lVar6 = 0;
        do {
          iVar15 = pVVar11->pArray[lVar6];
          if (((long)iVar15 < 0) || (pGia->nObjs <= iVar15)) goto LAB_00588fe1;
          if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = pGia->pObjs + iVar15;
          uVar16 = (uint)*(ulong *)pGVar4;
          *(ulong *)pGVar4 =
               *(ulong *)pGVar4 & 0xffffffffbfffffff |
               (ulong)((uVar16 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar16 & 0x1fffffff))) & 0x40000000
                      );
          lVar6 = lVar6 + 1;
          pVVar11 = pGia->vCos;
        } while (lVar6 < pVVar11->nSize);
      }
      iVar9 = p->iFrame;
      if (iVar14 == iVar9) break;
      iVar15 = pGia->nRegs;
      if (0 < iVar15) {
        iVar9 = 0;
        do {
          iVar2 = pGia->vCos->nSize;
          uVar16 = (iVar2 - iVar15) + iVar9;
          if (((int)uVar16 < 0) || (iVar2 <= (int)uVar16)) goto LAB_00589000;
          iVar2 = pGia->vCos->pArray[uVar16];
          if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_00588fe1;
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          iVar3 = pGia->vCis->nSize;
          uVar16 = (iVar3 - iVar15) + iVar9;
          if (((int)uVar16 < 0) || (iVar3 <= (int)uVar16)) goto LAB_00589000;
          uVar16 = pGia->vCis->pArray[uVar16];
          lVar6 = (long)(int)uVar16;
          if ((lVar6 < 0) || ((uint)pGia->nObjs <= uVar16)) goto LAB_00588fe1;
          *(ulong *)(pGVar4 + lVar6) =
               *(ulong *)(pGVar4 + lVar6) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar4 + iVar2) & 0x40000000);
          iVar9 = iVar9 + 1;
          iVar15 = pGia->nRegs;
        } while (iVar9 < iVar15);
        iVar9 = p->iFrame;
      }
      bVar5 = iVar14 < iVar9;
      iVar14 = iVar14 + 1;
    } while (bVar5);
  }
  if (iVar10 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0x84,"Gia_Man_t *Gia_ManVerifyCexAndMove(Gia_Man_t *, Abc_Cex_t *)");
  }
  uVar16 = p->iPo;
  iVar15 = pGia->nRegs;
  pVVar11 = pGia->vCos;
  iVar10 = pVVar11->nSize;
  if (iVar10 - iVar15 <= (int)uVar16) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (((int)uVar16 < 0) || (iVar10 <= (int)uVar16)) {
LAB_00589000:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar14 = pVVar11->pArray[uVar16];
  if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) {
LAB_00588fe1:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if ((pGia->pObjs[iVar14].field_0x3 & 0x40) == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0x86,"Gia_Man_t *Gia_ManVerifyCexAndMove(Gia_Man_t *, Abc_Cex_t *)");
  }
  pVVar13 = pGia->vCis;
  iVar14 = pVVar13->nSize;
  if (iVar15 < iVar14) {
    lVar6 = 0;
    do {
      if (iVar14 <= lVar6) goto LAB_00589000;
      iVar10 = pVVar13->pArray[lVar6];
      if (((long)iVar10 < 0) || (pGia->nObjs <= iVar10)) goto LAB_00588fe1;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &pGia->pObjs[iVar10].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar6 = lVar6 + 1;
      iVar15 = pGia->nRegs;
      pVVar13 = pGia->vCis;
      iVar14 = pVVar13->nSize;
    } while (lVar6 < iVar14 - iVar15);
    pVVar11 = pGia->vCos;
    iVar10 = pVVar11->nSize;
  }
  if (iVar15 < iVar10) {
    lVar6 = 0;
    do {
      if (iVar10 <= lVar6) goto LAB_00589000;
      iVar10 = pVVar11->pArray[lVar6];
      if (((long)iVar10 < 0) || (pGia->nObjs <= iVar10)) goto LAB_00588fe1;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &pGia->pObjs[iVar10].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar6 = lVar6 + 1;
      iVar15 = pGia->nRegs;
      pVVar11 = pGia->vCos;
      iVar10 = pVVar11->nSize;
    } while (lVar6 < iVar10 - iVar15);
  }
  if (0 < iVar15) {
    iVar10 = 0;
    do {
      iVar14 = pGia->vCos->nSize;
      uVar16 = (iVar14 - iVar15) + iVar10;
      if (((int)uVar16 < 0) || (iVar14 <= (int)uVar16)) goto LAB_00589000;
      iVar14 = pGia->vCos->pArray[uVar16];
      if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) goto LAB_00588fe1;
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar9 = pGia->vCis->nSize;
      uVar16 = (iVar9 - iVar15) + iVar10;
      if (((int)uVar16 < 0) || (iVar9 <= (int)uVar16)) goto LAB_00589000;
      uVar16 = pGia->vCis->pArray[uVar16];
      if (((long)(int)uVar16 < 0) || ((uint)pGia->nObjs <= uVar16)) goto LAB_00588fe1;
      *(ulong *)(pGVar4 + iVar14) =
           *(ulong *)(pGVar4 + iVar14) & 0xffffffffbfffffff |
           (ulong)((uint)*(undefined8 *)(pGVar4 + (int)uVar16) & 0x40000000);
      iVar10 = iVar10 + 1;
      iVar15 = pGia->nRegs;
    } while (iVar10 < iVar15);
  }
  pGVar8 = Gia_ManDupWithInit(pGia);
  Gia_ManCleanMark0(pGia);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManVerifyCexAndMove( Gia_Man_t * pGia, Abc_Cex_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Gia_ManCleanMark0(pGia);
    Gia_ManForEachRo( pGia, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pGia, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pGia, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pGia, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    RetValue = Gia_ManPo(pGia, p->iPo)->fMark0;
    assert( RetValue );
    // set PI/PO values to zero and transfer RO values to RI
    Gia_ManForEachPi( pGia, pObj, k )
        pObj->fMark0 = 0;
    Gia_ManForEachPo( pGia, pObj, k )
        pObj->fMark0 = 0;
    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, k )
        pObjRi->fMark0 = pObjRo->fMark0;
    // duplicate assuming CI/CO marks are set correctly
    pNew = Gia_ManDupWithInit( pGia );
    Gia_ManCleanMark0(pGia);
    return pNew;
}